

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction.cpp
# Opt level: O3

Address * __thiscall
cfd::TransactionContext::GetTxOutAddress
          (Address *__return_storage_ptr__,TransactionContext *this,uint32_t index,NetType net_type)

{
  CfdException *this_00;
  ulong uVar1;
  ulong uVar2;
  AddressFactory address_factory;
  Script local_80;
  AddressFactory local_48;
  
  uVar1 = ((long)(this->super_Transaction).vout_.
                 super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(this->super_Transaction).vout_.
                 super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>._M_impl.
                 super__Vector_impl_data._M_start >> 4) * -0x3333333333333333;
  uVar2 = (ulong)index;
  if (uVar2 <= uVar1 && uVar1 - uVar2 != 0) {
    AddressFactory::AddressFactory(&local_48,net_type);
    core::AbstractTxOut::GetLockingScript
              (&local_80,
               &(this->super_Transaction).vout_.
                super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>._M_impl.
                super__Vector_impl_data._M_start[uVar2].super_AbstractTxOut);
    AddressFactory::GetAddressByLockingScript(__return_storage_ptr__,&local_48,&local_80);
    core::Script::~Script(&local_80);
    local_48._vptr_AddressFactory = (_func_int **)&PTR__AddressFactory_0086bad8;
    std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
    ~vector(&local_48.prefix_list_);
    return __return_storage_ptr__;
  }
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  local_80._vptr_Script =
       (_func_int **)
       ((long)&local_80.script_data_.data_.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data + 8);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"vout out_of_range error.","")
  ;
  core::CfdException::CfdException(this_00,kCfdOutOfRangeError,(string *)&local_80);
  __cxa_throw(this_00,&core::CfdException::typeinfo,core::CfdException::~CfdException);
}

Assistant:

Address TransactionContext::GetTxOutAddress(
    uint32_t index, NetType net_type) const {
  if (vout_.size() <= index) {
    throw CfdException(
        CfdError::kCfdOutOfRangeError, "vout out_of_range error.");
  }
  AddressFactory address_factory(net_type);
  return address_factory.GetAddressByLockingScript(
      vout_[index].GetLockingScript());
}